

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

bool deqp::gls::FboUtil::detectGLESCompatibleContext
               (RenderContext *ctx,int requiredMajor,int requiredMinor)

{
  int iVar1;
  undefined4 extraout_var;
  bool local_2a;
  bool local_29;
  int local_28;
  int local_24;
  GLint minorVersion;
  GLint majorVersion;
  Functions *gl;
  int requiredMinor_local;
  int requiredMajor_local;
  RenderContext *ctx_local;
  
  gl._0_4_ = requiredMinor;
  gl._4_4_ = requiredMajor;
  _requiredMinor_local = ctx;
  iVar1 = (*ctx->_vptr_RenderContext[3])();
  _minorVersion = CONCAT44(extraout_var,iVar1);
  local_24 = 0;
  local_28 = 0;
  (**(code **)(_minorVersion + 0x868))(0x821b,&local_24);
  iVar1 = (**(code **)(_minorVersion + 0x800))();
  if (iVar1 != 0) {
    local_24 = 2;
  }
  (**(code **)(_minorVersion + 0x868))(0x821c,&local_28);
  iVar1 = (**(code **)(_minorVersion + 0x800))();
  if (iVar1 != 0) {
    local_28 = 0;
  }
  local_29 = true;
  if (local_24 <= gl._4_4_) {
    local_2a = local_24 == gl._4_4_ && (int)gl <= local_28;
    local_29 = local_2a;
  }
  return local_29;
}

Assistant:

static bool detectGLESCompatibleContext (const RenderContext& ctx, int requiredMajor, int requiredMinor)
{
	const glw::Functions&	gl				= ctx.getFunctions();
	glw::GLint				majorVersion	= 0;
	glw::GLint				minorVersion	= 0;

	// Detect compatible GLES context by querying GL_MAJOR_VERSION.
	// This query does not exist on GLES2 so a failing query implies
	// GLES2 context.

	gl.getIntegerv(GL_MAJOR_VERSION, &majorVersion);
	if (gl.getError() != GL_NO_ERROR)
		majorVersion = 2;

	gl.getIntegerv(GL_MINOR_VERSION, &minorVersion);
	if (gl.getError() != GL_NO_ERROR)
		minorVersion = 0;

	return (majorVersion > requiredMajor) || (majorVersion == requiredMajor && minorVersion >= requiredMinor);
}